

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopeGuard.cc
# Opt level: O0

void dismiss_test(void)

{
  uint uVar1;
  UnitTest *pUVar2;
  undefined8 uVar3;
  ostream *poVar4;
  allocator local_99;
  string local_98 [32];
  BaseCase *local_78;
  BaseCase *cur_case;
  anon_class_8_1_898bac6a local_60;
  function<void_()> local_58;
  undefined1 local_38 [8];
  ScopeGuard s;
  bool flag;
  
  s._39_1_ = 1;
  local_60.flag = (bool *)&s.field_0x27;
  std::function<void()>::function<dismiss_test()::__0,void>((function<void()> *)&local_58,&local_60)
  ;
  ScopeGuard::ScopeGuard((ScopeGuard *)local_38,&local_58);
  std::function<void_()>::~function(&local_58);
  ScopeGuard::dismiss((ScopeGuard *)local_38,true);
  ScopeGuard::~ScopeGuard((ScopeGuard *)local_38);
  pUVar2 = UnitTest::getInstance();
  local_78 = UnitTest::currentCase(pUVar2);
  uVar1 = (*local_78->_vptr_BaseCase[2])();
  if ((uVar1 & 1) == 0) {
    pUVar2 = UnitTest::getInstance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/ScopeGuard.cc"
               ,&local_99);
    UnitTest::checkFile(pUVar2,(string *)local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    pUVar2 = UnitTest::getInstance();
    UnitTest::checkLine(pUVar2,0x2f);
    if ((s._39_1_ & 1) == 0) {
      pUVar2 = UnitTest::getInstance();
      UnitTest::incFailure(pUVar2);
      poVar4 = std::operator<<((ostream *)&std::cout,">>> check \"");
      poVar4 = std::operator<<(poVar4,"flag");
      poVar4 = std::operator<<(poVar4,"\" failed.");
      poVar4 = std::operator<<(poVar4,"at ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/ScopeGuard.cc"
                              );
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2f);
      poVar4 = std::operator<<(poVar4,")");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      do_check_failed<>();
    }
    return;
  }
  uVar3 = __cxa_allocate_exception(1);
  __cxa_throw(uVar3,&AbortThisCase::typeinfo,0);
}

Assistant:

TEST_CASE(dismiss_test)
{
    bool flag = true;
    {
        ScopeGuard s{[&]{ flag = false; }};
        s.dismiss();
    }
    TEST_CHECK(flag);
}